

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# biginteger.h
# Opt level: O2

void __thiscall
rapidjson::internal::BigInteger::BigInteger(BigInteger *this,char *decimals,size_t length)

{
  RapidJSONException *this_00;
  
  this->count_ = 1;
  if (length == 0) {
    this_00 = (RapidJSONException *)__cxa_allocate_exception(0x10);
    cereal::RapidJSONException::RapidJSONException
              (this_00,"rapidjson internal assertion failure: length > 0");
    __cxa_throw(this_00,&cereal::RapidJSONException::typeinfo,std::runtime_error::~runtime_error);
  }
  this->digits_[0] = 0;
  for (; 0x12 < length; length = length - 0x13) {
    AppendDecimal64(this,decimals,decimals + 0x13);
    decimals = decimals + 0x13;
  }
  if (length != 0) {
    AppendDecimal64(this,decimals,decimals + length);
    return;
  }
  return;
}

Assistant:

BigInteger(const char* decimals, size_t length) : count_(1) {
        CEREAL_RAPIDJSON_ASSERT(length > 0);
        digits_[0] = 0;
        size_t i = 0;
        const size_t kMaxDigitPerIteration = 19;  // 2^64 = 18446744073709551616 > 10^19
        while (length >= kMaxDigitPerIteration) {
            AppendDecimal64(decimals + i, decimals + i + kMaxDigitPerIteration);
            length -= kMaxDigitPerIteration;
            i += kMaxDigitPerIteration;
        }

        if (length > 0)
            AppendDecimal64(decimals + i, decimals + i + length);
    }